

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

par_shapes_mesh * par_shapes_create_disk(float radius,int slices,float *center,float *normal)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  par_shapes_mesh *mesh;
  float *pfVar6;
  uint16_t *puVar7;
  uint16_t uVar8;
  int iVar9;
  long *in_FS_OFFSET;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  char *local_130;
  char *pcStack_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float *local_100;
  double local_f8;
  double local_f0;
  undefined8 local_e8;
  long lStack_e0;
  undefined4 local_d8;
  char *local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  long lStack_b0;
  undefined4 local_a8;
  char *local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  long lStack_80;
  undefined4 local_78;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  long local_40;
  code *local_38;
  
  lVar2 = *in_FS_OFFSET + -0x430;
  local_40 = in_FS_OFFSET[-0x86];
  local_38 = (code *)in_FS_OFFSET[-0x85];
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_128 = "rf_calloc_wrapper";
  local_120 = 0x27;
  local_58 = 0;
  uStack_50 = 0x30;
  local_48 = 0;
  local_100 = center;
  mesh = (par_shapes_mesh *)(*local_38)(&local_40,1);
  mesh->points = (float *)0x0;
  *(undefined8 *)&mesh->npoints = 0;
  mesh->triangles = (uint16_t *)0x0;
  *(undefined8 *)&mesh->ntriangles = 0;
  mesh->normals = (float *)0x0;
  mesh->tcoords = (float *)0x0;
  mesh->npoints = slices + 1;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_68 = "par_shapes_create_disk";
  local_60 = 0x6135;
  local_88 = 0;
  lStack_80 = (long)((slices + 1) * 3) << 2;
  local_78 = 0;
  pfVar6 = (float *)(*(code *)in_FS_OFFSET[-0x85])(lVar2,1);
  mesh->points = pfVar6;
  pfVar6[0] = 0.0;
  pfVar6[1] = 0.0;
  pfVar6[2] = 0.0;
  if (0 < slices) {
    local_f8 = (double)slices;
    local_118 = (double)radius;
    pfVar6 = pfVar6 + 5;
    dVar5 = 0.0;
    iVar9 = slices;
    do {
      local_f0 = (double)(float)((dVar5 * 3.14159265359 + dVar5 * 3.14159265359) / local_f8);
      dVar4 = cos(local_f0);
      pfVar6[-2] = (float)(dVar4 * local_118);
      dVar4 = sin(local_f0);
      pfVar6[-1] = (float)(dVar4 * local_118);
      *pfVar6 = 0.0;
      dVar5 = dVar5 + 1.0;
      pfVar6 = pfVar6 + 3;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  fVar16 = *normal;
  fVar11 = (float)*(undefined8 *)(normal + 1);
  fVar12 = (float)((ulong)*(undefined8 *)(normal + 1) >> 0x20);
  fVar10 = SQRT(fVar12 * fVar12 + fVar16 * fVar16 + fVar11 * fVar11);
  fVar13 = 1.0 / fVar10;
  if (0.0 < fVar10) {
    fVar16 = fVar16 * fVar13;
  }
  uVar14 = (int)((uint)(0.0 < fVar10) << 0x1f) >> 0x1f;
  uVar15 = (int)((uint)(0.0 < fVar10) << 0x1f) >> 0x1f;
  local_118 = (double)(CONCAT44(~uVar15 & (uint)fVar12,~uVar14 & (uint)fVar11) |
                      CONCAT44((uint)(fVar13 * fVar12) & uVar15,(uint)(fVar13 * fVar11) & uVar14));
  uStack_110 = 0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_98 = "par_shapes_create_disk";
  local_90 = 0x6142;
  local_b8 = 0;
  lStack_b0 = (long)mesh->npoints * 0xc;
  local_a8 = 0;
  pfVar6 = (float *)(*(code *)in_FS_OFFSET[-0x85])(lVar2,1);
  mesh->normals = pfVar6;
  iVar9 = mesh->npoints;
  if (0 < iVar9) {
    do {
      *pfVar6 = fVar16;
      pfVar6[1] = (float)local_118;
      pfVar6[2] = local_118._4_4_;
      pfVar6 = pfVar6 + 3;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  mesh->ntriangles = slices;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_c8 = "par_shapes_create_disk";
  local_c0 = 0x614a;
  local_e8 = 0;
  lStack_e0 = (long)(slices * 3) * 2;
  local_d8 = 0;
  puVar7 = (uint16_t *)(*(code *)in_FS_OFFSET[-0x85])(lVar2,1);
  mesh->triangles = puVar7;
  if (0 < slices) {
    iVar9 = 0;
    do {
      *puVar7 = 0;
      iVar1 = iVar9 + 1;
      puVar7[1] = (uint16_t)iVar1;
      uVar8 = (short)iVar9 + 2;
      if (iVar9 - slices == -1) {
        uVar8 = 1;
      }
      puVar7[2] = uVar8;
      puVar7 = puVar7 + 3;
      iVar9 = iVar1;
    } while (iVar1 != slices);
  }
  fVar11 = (float)local_118 * -1.0 + local_118._4_4_ * -0.0;
  fVar12 = local_118._4_4_ * 0.0 + fVar16;
  fVar16 = fVar16 * 0.0 + (float)local_118 * -0.0;
  local_130 = (char *)CONCAT44(fVar12,fVar11);
  fVar10 = SQRT(fVar16 * fVar16 + fVar11 * fVar11 + fVar12 * fVar12);
  if (0.0 < fVar10) {
    fVar10 = 1.0 / fVar10;
    fVar16 = fVar16 * fVar10;
    local_130 = (char *)CONCAT44(fVar12 * fVar10,fVar11 * fVar10);
  }
  pcStack_128 = (char *)CONCAT44(pcStack_128._4_4_,fVar16);
  dVar5 = acos((double)local_118._4_4_);
  par_shapes_rotate(mesh,(float)dVar5,(float *)&local_130);
  iVar9 = mesh->npoints;
  if (0 < iVar9) {
    uVar3 = *(undefined8 *)local_100;
    fVar16 = local_100[2];
    pfVar6 = mesh->points;
    do {
      *(ulong *)pfVar6 =
           CONCAT44((float)((ulong)*(undefined8 *)pfVar6 >> 0x20) + (float)((ulong)uVar3 >> 0x20),
                    (float)*(undefined8 *)pfVar6 + (float)uVar3);
      pfVar6[2] = pfVar6[2] + fVar16;
      pfVar6 = pfVar6 + 3;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return mesh;
}

Assistant:

PARDEF par_shapes_mesh* par_shapes_create_disk(float radius, int slices,
                                        float const* center, float const* normal)
{
    par_shapes_mesh* mesh = PAR_CALLOC(par_shapes_mesh, 1);
    mesh->npoints = slices + 1;
    mesh->points = PAR_MALLOC(float, 3 * mesh->npoints);
    float* points = mesh->points;
    *points++ = 0;
    *points++ = 0;
    *points++ = 0;
    for (int i = 0; i < slices; i++) {
        float theta = i * PAR_PI * 2 / slices;
        *points++ = radius * cos(theta);
        *points++ = radius * sin(theta);
        *points++ = 0;
    }
    float nnormal[3] = {normal[0], normal[1], normal[2]};
    par_shapes__normalize3(nnormal);
    mesh->normals = PAR_MALLOC(float, 3 * mesh->npoints);
    float* norms = mesh->normals;
    for (int i = 0; i < mesh->npoints; i++) {
        *norms++ = nnormal[0];
        *norms++ = nnormal[1];
        *norms++ = nnormal[2];
    }
    mesh->ntriangles = slices;
    mesh->triangles = PAR_MALLOC(PAR_SHAPES_T, 3 * mesh->ntriangles);
    PAR_SHAPES_T* triangles = mesh->triangles;
    for (int i = 0; i < slices; i++) {
        *triangles++ = 0;
        *triangles++ = 1 + i;
        *triangles++ = 1 + (i + 1) % slices;
    }
    float k[3] = {0, 0, -1};
    float axis[3];
    par_shapes__cross3(axis, nnormal, k);
    par_shapes__normalize3(axis);
    par_shapes_rotate(mesh, acos(nnormal[2]), axis);
    par_shapes_translate(mesh, center[0], center[1], center[2]);
    return mesh;
}